

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseTagModuleField(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Module *pMVar1;
  bool bVar2;
  Result RVar3;
  pointer pTVar4;
  pointer pTVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> local_1e0;
  Enum local_1d8;
  Enum local_1d4;
  undefined1 local_1d0 [8];
  __single_object field_1;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_1a0;
  __single_object field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string asStack_170 [32];
  string asStack_150 [32];
  iterator local_130;
  size_type local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  Enum local_108;
  Enum local_104;
  Enum local_100;
  Enum local_fc;
  Tag *local_f8;
  Tag *tag;
  __single_object import;
  undefined1 local_e0 [8];
  ModuleFieldList export_fields;
  string name;
  Location loc;
  Token local_80;
  size_t local_40;
  char *local_38;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_30;
  undefined8 local_28;
  Module *local_20;
  Module *module_local;
  WastParser *this_local;
  
  local_20 = module;
  module_local = (Module *)this;
  bVar2 = Features::exceptions_enabled((Features *)this->options_);
  if (bVar2) {
    RVar3 = Expect(this,Lpar);
    bVar2 = Failed(RVar3);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar3 = Expect(this,Tag);
      bVar2 = Failed(RVar3);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        GetLocation((Location *)((long)&name.field_2 + 8),this);
        std::__cxx11::string::string((string *)&export_fields.size_);
        ParseBindVarOpt(this,(string *)&export_fields.size_);
        intrusive_list<wabt::ModuleField>::intrusive_list
                  ((intrusive_list<wabt::ModuleField> *)local_e0);
        import._M_t.super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
        super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._4_4_ =
             ParseInlineExports(this,(ModuleFieldList *)local_e0,Last);
        bVar2 = Failed(import._M_t.
                       super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>
                       .super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._4_4_);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>.
          _M_t.super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
          super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          bVar2 = PeekMatchLpar(this,Import);
          if (bVar2) {
            CheckImportOrdering(this,local_20);
            std::make_unique<wabt::TagImport,std::__cxx11::string&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tag);
            pTVar4 = std::unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_>::
                     operator->((unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_>
                                 *)&tag);
            local_f8 = &pTVar4->tag;
            pTVar4 = std::unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_>::get
                               ((unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_>
                                 *)&tag);
            local_fc = (Enum)ParseInlineImport(this,(Import *)pTVar4);
            bVar2 = Failed((Result)local_fc);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
              super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              local_100 = (Enum)ParseTypeUseOpt(this,&local_f8->decl);
              bVar2 = Failed((Result)local_100);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t.
                super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
                super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                local_104 = (Enum)ParseUnboundFuncSignature(this,&(local_f8->decl).sig);
                bVar2 = Failed((Result)local_104);
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t
                  .super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
                  super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_190,"type",
                             (allocator<char> *)
                             ((long)&field._M_t.
                                     super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                     .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                     _M_head_impl + 7));
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (asStack_170,"param",
                             (allocator<char> *)
                             ((long)&field._M_t.
                                     super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                     .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                     _M_head_impl + 6));
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (asStack_150,"result",
                             (allocator<char> *)
                             ((long)&field._M_t.
                                     super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                     .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                     _M_head_impl + 5));
                  local_130 = &local_190;
                  local_128 = 3;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&field._M_t.
                                         super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                         _M_head_impl + 4));
                  __l._M_len = local_128;
                  __l._M_array = local_130;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_120,__l,
                           (allocator_type *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 4));
                  local_108 = (Enum)ErrorIfLpar(this,&local_120,(char *)0x0);
                  bVar2 = Failed((Result)local_108);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_120);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&field._M_t.
                                          super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                          _M_head_impl + 4));
                  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_130;
                  do {
                    local_1f8 = local_1f8 + -1;
                    std::__cxx11::string::~string((string *)local_1f8);
                  } while (local_1f8 != &local_190);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&field._M_t.
                                     super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                     .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                     _M_head_impl + 5));
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&field._M_t.
                                     super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                     .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                     _M_head_impl + 6));
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&field._M_t.
                                     super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                     .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                     _M_head_impl + 7));
                  if (bVar2) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    import._M_t.
                    super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>
                    .super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
                  }
                  else {
                    GetLocation((Location *)&stack0xfffffffffffffe40,this);
                    std::
                    make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TagImport,std::default_delete<wabt::TagImport>>,wabt::Location>
                              ((unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_> *
                               )&local_1a0,(Location *)&tag);
                    pMVar1 = local_20;
                    std::
                    unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                    ::unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&field_1,&local_1a0);
                    Module::AppendField(pMVar1,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                                *)&field_1);
                    std::
                    unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                    ::~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   *)&field_1);
                    std::
                    unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                    ::~unique_ptr(&local_1a0);
                    import._M_t.
                    super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>
                    .super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 0;
                  }
                }
              }
            }
            std::unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_>::~unique_ptr
                      ((unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_> *)&tag);
            pMVar1 = local_20;
          }
          else {
            std::make_unique<wabt::TagModuleField,wabt::Location&,std::__cxx11::string&>
                      ((Location *)local_1d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&name.field_2 + 8));
            pTVar5 = std::
                     unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::
                     operator->((unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                                 *)local_1d0);
            local_1d4 = (Enum)ParseTypeUseOpt(this,&(pTVar5->tag).decl);
            bVar2 = Failed((Result)local_1d4);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
              super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              pTVar5 = std::
                       unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                       ::operator->((unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                                     *)local_1d0);
              local_1d8 = (Enum)ParseUnboundFuncSignature(this,&(pTVar5->tag).decl.sig);
              bVar2 = Failed((Result)local_1d8);
              pMVar1 = local_20;
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t.
                super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
                super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::
                unique_ptr(&local_1e0,
                           (unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                            *)local_1d0);
                Module::AppendField(pMVar1,&local_1e0);
                std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::
                ~unique_ptr(&local_1e0);
                import._M_t.
                super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t.
                super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
                super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 0;
              }
            }
            std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::
            ~unique_ptr((unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                         *)local_1d0);
            pMVar1 = local_20;
          }
          local_20 = pMVar1;
          if ((int)import._M_t.
                   super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
                   super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl == 0) {
            sVar6 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::size(&pMVar1->tags);
            anon_unknown_1::AppendInlineExportFields
                      (pMVar1,(ModuleFieldList *)local_e0,(int)sVar6 - 1);
            RVar3 = Expect(this,Rpar);
            bVar2 = Failed(RVar3);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
              super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              Result::Result((Result *)((long)&this_local + 4),Ok);
              import._M_t.
              super___uniq_ptr_impl<wabt::TagImport,_std::default_delete<wabt::TagImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::TagImport_*,_std::default_delete<wabt::TagImport>_>.
              super__Head_base<0UL,_wabt::TagImport_*,_false>._M_head_impl._0_4_ = 1;
            }
          }
        }
        intrusive_list<wabt::ModuleField>::~intrusive_list
                  ((intrusive_list<wabt::ModuleField> *)local_e0);
        std::__cxx11::string::~string((string *)&export_fields.size_);
      }
    }
  }
  else {
    Consume(&local_80,this);
    local_40 = local_80.loc.filename._M_len;
    local_38 = local_80.loc.filename._M_str;
    local_30.offset = (size_t)local_80.loc.field_1.field_1.offset;
    local_28 = local_80.loc.field_1._8_8_;
    Error(this,0x35d29f);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseTagModuleField(Module* module) {
  WABT_TRACE(ParseTagModuleField);
  if (!options_->features.exceptions_enabled()) {
    Error(Consume().loc, "tag not allowed");
    return Result::Error;
  }
  EXPECT(Lpar);
  EXPECT(Tag);
  Location loc = GetLocation();

  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Tag));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TagImport>(name);
    Tag& tag = import->tag;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&tag.decl.sig));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<TagModuleField>(loc, name);
    CHECK_RESULT(ParseTypeUseOpt(&field->tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&field->tag.decl.sig));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tags.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}